

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_heat1D_adapt.c
# Opt level: O1

int main(void)

{
  undefined1 auVar1 [16];
  N_Vector p_Var2;
  sunindextype Nnew_00;
  uint uVar3;
  UserData udata;
  sunrealtype *psVar4;
  N_Vector p_Var5;
  FILE *pFVar6;
  FILE *pFVar7;
  long lVar8;
  char *pcVar9;
  ulong uVar10;
  long lVar11;
  double dVar12;
  undefined1 auVar13 [16];
  void *arkode_mem;
  SUNContext ctx;
  sunrealtype newdt;
  sunrealtype olddt;
  sunrealtype t;
  long nli;
  long nni;
  sunindextype Nnew;
  long local_b0;
  N_Vector local_a8;
  undefined8 local_a0;
  long local_98;
  long local_90;
  undefined8 local_88;
  undefined8 local_80;
  double local_78;
  FILE *local_70;
  long local_68;
  long local_60;
  FILE *local_58;
  ulong local_50;
  long local_48;
  undefined8 local_40;
  sunindextype local_38;
  
  local_b0 = 0;
  uVar3 = SUNContext_Create(0,&local_a0);
  if ((int)uVar3 < 0) {
    pcVar9 = "SUNContext_Create";
  }
  else {
    udata = (UserData)malloc(0x20);
    udata->N = 0x15;
    udata->k = 0.5;
    udata->refine_tol = 0.003;
    psVar4 = (sunrealtype *)malloc(0xa8);
    udata->x = psVar4;
    auVar1 = _DAT_00104030;
    lVar8 = 1;
    auVar13 = _DAT_00104020;
    do {
      if (SUB164(auVar13 ^ auVar1,4) == -0x80000000 && SUB164(auVar13 ^ auVar1,0) < -0x7fffffeb) {
        psVar4[lVar8 + -1] = (double)(lVar8 + -1) / 20.0;
        psVar4[lVar8] = (double)lVar8 / 20.0;
      }
      lVar11 = auVar13._8_8_;
      auVar13._0_8_ = auVar13._0_8_ + 2;
      auVar13._8_8_ = lVar11 + 2;
      lVar8 = lVar8 + 2;
    } while (lVar8 != 0x17);
    puts("\n1D adaptive Heat PDE test problem:");
    printf("  diffusion coefficient:  k = %g\n",udata->k);
    printf("  initial N = %li\n",udata->N);
    p_Var5 = (N_Vector)N_VNew_Serial(0x15,local_a0);
    if (p_Var5 == (N_Vector)0x0) {
      main_cold_6();
      return 1;
    }
    N_VConst(0,p_Var5);
    pFVar6 = fopen("heat_mesh.txt","w");
    if (0 < udata->N) {
      lVar8 = 0;
      do {
        fprintf(pFVar6," %.16e",udata->x[lVar8]);
        lVar8 = lVar8 + 1;
      } while (lVar8 < udata->N);
    }
    fputc(10,pFVar6);
    pFVar7 = fopen("heat1D.txt","w");
    local_a8 = p_Var5;
    lVar8 = N_VGetArrayPointer(p_Var5);
    if (0 < udata->N) {
      lVar11 = 0;
      do {
        fprintf(pFVar7," %.16e",*(undefined8 *)(lVar8 + lVar11 * 8));
        lVar11 = lVar11 + 1;
      } while (lVar11 < udata->N);
    }
    fputc(10,pFVar7);
    p_Var5 = local_a8;
    local_b0 = ARKStepCreate(0,0,f,local_a8,local_a0);
    if (local_b0 == 0) {
      main_cold_5();
      return 1;
    }
    uVar3 = ARKodeSetUserData(local_b0,udata);
    if ((int)uVar3 < 0) {
      pcVar9 = "ARKodeSetUserData";
    }
    else {
      uVar3 = ARKodeSetMaxNumSteps(local_b0,10000);
      if ((int)uVar3 < 0) {
        pcVar9 = "ARKodeSetMaxNumSteps";
      }
      else {
        uVar3 = ARKodeSStolerances(0x3f50624dd2f1a9fc,0x3ddb7cdfd9d7bdbb,local_b0);
        if (-1 < (int)uVar3) {
          local_70 = pFVar7;
          uVar3 = ARKStepSetAdaptivityMethod(local_b0,2,1,0,0);
          if ((int)uVar3 < 0) {
            pcVar9 = "ARKodeSetAdaptivityMethod";
          }
          else {
            uVar3 = ARKodeSetPredictorMethod(local_b0,0);
            if ((int)uVar3 < 0) {
              pcVar9 = "ARKodeSetPredictorMethod";
            }
            else {
              uVar3 = ARKodeSetLinear(local_b0,1);
              if ((int)uVar3 < 0) {
                pcVar9 = "ARKodeSetLinear";
              }
              else {
                lVar8 = SUNLinSol_PCG(p_Var5,0,0x15,local_a0);
                if (lVar8 == 0) {
                  main_cold_4();
                  return 1;
                }
                uVar3 = ARKodeSetLinearSolver(local_b0,lVar8,0);
                if ((int)uVar3 < 0) {
                  pcVar9 = "ARKodeSetLinearSolver";
                }
                else {
                  uVar3 = ARKodeSetJacTimes(local_b0,0,Jac);
                  if (-1 < (int)uVar3) {
                    local_78 = 0.0;
                    local_80 = 0;
                    local_88 = 0;
                    puts(
                        "  iout          dt_old                 dt_new               ||u||_rms       N   NNI  NLI"
                        );
                    puts(
                        " ----------------------------------------------------------------------------------------"
                        );
                    local_90 = local_80;
                    local_98 = local_88;
                    dVar12 = (double)N_VDotProd(p_Var5,p_Var5);
                    dVar12 = dVar12 / (double)udata->N;
                    if (dVar12 < 0.0) {
                      dVar12 = sqrt(dVar12);
                    }
                    else {
                      dVar12 = SQRT(dVar12);
                    }
                    printf(" %4i  %19.15e  %19.15e  %19.15e  %li   %2i  %3i\n",local_90,local_98,
                           dVar12,0,udata->N,0,0);
                    local_98 = 0;
                    local_90 = 0;
                    uVar10 = 0;
                    local_58 = pFVar6;
                    do {
                      pFVar6 = local_58;
                      if (1.0 <= local_78) {
                        puts(
                            " ----------------------------------------------------------------------------------------"
                            );
                        puts(" Final solver statistics:");
                        printf("   Total number of time steps = %i\n",uVar10 & 0xffffffff);
                        printf("   Total nonlinear iterations = %li\n",local_98);
                        printf("   Total linear iterations    = %li\n\n",local_90);
                        fclose(local_70);
                        fclose(pFVar6);
                        N_VDestroy(p_Var5);
                        free(udata->x);
                        free(udata);
                        ARKodeFree(&local_b0);
                        SUNLinSolFree(lVar8);
                        SUNContext_Free(&local_a0);
                        return 0;
                      }
                      uVar3 = ARKodeSetStopTime(local_b0);
                      if ((int)uVar3 < 0) {
                        pcVar9 = "ARKodeSetStopTime";
                        goto LAB_00102e88;
                      }
                      uVar3 = ARKodeEvolve(0x3ff0000000000000,local_b0,p_Var5,&local_78,2);
                      if ((int)uVar3 < 0) {
                        pcVar9 = "ARKodeEvolve";
                        goto LAB_00102e88;
                      }
                      uVar3 = ARKodeGetLastStep(local_b0,&local_80);
                      if ((int)uVar3 < 0) {
                        pcVar9 = "ARKodeGetLastStep";
                        goto LAB_00102e88;
                      }
                      uVar3 = ARKodeGetCurrentStep(local_b0,&local_88);
                      if ((int)uVar3 < 0) {
                        pcVar9 = "ARKodeGetCurrentStep";
                        goto LAB_00102e88;
                      }
                      uVar3 = ARKodeGetNumNonlinSolvIters(local_b0,&local_60);
                      if ((int)uVar3 < 0) {
                        pcVar9 = "ARKodeGetNumNonlinSolvIters";
                        goto LAB_00102e88;
                      }
                      uVar3 = ARKodeGetNumLinIters(local_b0,&local_68);
                      if ((int)uVar3 < 0) {
                        pcVar9 = "ARKodeGetNumLinIters";
                        goto LAB_00102e88;
                      }
                      local_a8 = (N_Vector)local_80;
                      local_40 = local_88;
                      dVar12 = (double)N_VDotProd(p_Var5,p_Var5);
                      dVar12 = dVar12 / (double)udata->N;
                      local_48 = lVar8;
                      if (dVar12 < 0.0) {
                        dVar12 = sqrt(dVar12);
                      }
                      else {
                        dVar12 = SQRT(dVar12);
                      }
                      local_50 = (ulong)((int)uVar10 + 1);
                      printf(" %4i  %19.15e  %19.15e  %19.15e  %li   %2li  %3li\n",local_a8,local_40
                             ,dVar12,local_50,udata->N,local_60,local_68);
                      local_98 = local_98 + local_60;
                      local_90 = local_90 + local_68;
                      local_a8 = p_Var5;
                      lVar8 = N_VGetArrayPointer(p_Var5);
                      pFVar7 = local_70;
                      if (0 < udata->N) {
                        lVar11 = 0;
                        do {
                          fprintf(pFVar7," %.16e",*(undefined8 *)(lVar8 + lVar11 * 8));
                          lVar11 = lVar11 + 1;
                        } while (lVar11 < udata->N);
                      }
                      fputc(10,pFVar7);
                      if (0 < udata->N) {
                        lVar8 = 0;
                        do {
                          fprintf(pFVar6," %.16e",udata->x[lVar8]);
                          lVar8 = lVar8 + 1;
                        } while (lVar8 < udata->N);
                      }
                      fputc(10,pFVar6);
                      psVar4 = adapt_mesh(local_a8,&local_38,udata);
                      Nnew_00 = local_38;
                      if (psVar4 == (sunrealtype *)0x0) {
                        main_cold_3();
                        return 1;
                      }
                      p_Var5 = (N_Vector)N_VNew_Serial(local_38,local_a0);
                      p_Var2 = local_a8;
                      if (p_Var5 == (N_Vector)0x0) {
                        main_cold_2();
                        return 1;
                      }
                      project(udata->N,udata->x,local_a8,Nnew_00,psVar4,p_Var5);
                      N_VDestroy(p_Var2);
                      free(udata->x);
                      udata->x = psVar4;
                      udata->N = Nnew_00;
                      uVar3 = ARKodeResize(0x3ff0000000000000,local_78,local_b0,p_Var5,0,0);
                      if ((int)uVar3 < 0) {
                        pcVar9 = "ARKodeResize";
                        goto LAB_00102e88;
                      }
                      SUNLinSolFree(local_48);
                      lVar8 = SUNLinSol_PCG(p_Var5,0,0x15,local_a0);
                      if (lVar8 == 0) {
                        main_cold_1();
                        return 1;
                      }
                      uVar3 = ARKodeSetLinearSolver(local_b0,lVar8,0);
                      if ((int)uVar3 < 0) {
                        pcVar9 = "ARKodeSetLinearSolver";
                        goto LAB_00102e88;
                      }
                      uVar3 = ARKodeSetJacTimes(local_b0,0,Jac);
                      uVar10 = local_50;
                    } while (-1 < (int)uVar3);
                    pcVar9 = "ARKodeSetJacTimes";
                    goto LAB_00102e88;
                  }
                  pcVar9 = "ARKodeSetJacTimes";
                }
              }
            }
          }
          fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",pcVar9,(ulong)uVar3);
          return 1;
        }
        pcVar9 = "ARKodeSStolerances";
      }
    }
  }
LAB_00102e88:
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",pcVar9,(ulong)uVar3);
  return 1;
}

Assistant:

int main(void)
{
  /* general problem parameters */
  sunrealtype T0     = SUN_RCONST(0.0);    /* initial time */
  sunrealtype Tf     = SUN_RCONST(1.0);    /* final time */
  sunrealtype rtol   = SUN_RCONST(1.e-3);  /* relative tolerance */
  sunrealtype atol   = SUN_RCONST(1.e-10); /* absolute tolerance */
  sunrealtype hscale = SUN_RCONST(1.0); /* time step change factor on resizes */
  UserData udata     = NULL;
  sunrealtype* data;
  sunindextype N     = 21;                 /* initial spatial mesh size */
  sunrealtype refine = SUN_RCONST(3.0e-3); /* adaptivity refinement tolerance */
  sunrealtype k      = SUN_RCONST(0.5);    /* heat conductivity */
  sunindextype i;
  long int nni, nni_tot = 0, nli, nli_tot = 0;
  int iout = 0;

  /* general problem variables */
  int flag;                  /* reusable error-checking flag */
  N_Vector y         = NULL; /* empty vector for storing solution */
  N_Vector y2        = NULL; /* empty vector for storing solution */
  N_Vector yt        = NULL; /* empty vector for swapping */
  SUNLinearSolver LS = NULL; /* empty linear solver object */
  void* arkode_mem   = NULL; /* empty ARKode memory structure */
  FILE *XFID, *UFID;
  sunrealtype t, olddt, newdt;
  sunrealtype* xnew = NULL;
  sunindextype Nnew;

  /* Create the SUNDIALS context object for this simulation */
  SUNContext ctx;
  flag = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_flag(&flag, "SUNContext_Create", 1)) { return 1; }

  /* allocate and fill initial udata structure */
  udata             = (UserData)malloc(sizeof(*udata));
  udata->N          = N;
  udata->k          = k;
  udata->refine_tol = refine;
  udata->x          = malloc(N * sizeof(sunrealtype));
  for (i = 0; i < N; i++) { udata->x[i] = ONE * i / (N - 1); }

  /* Initial problem output */
  printf("\n1D adaptive Heat PDE test problem:\n");
  printf("  diffusion coefficient:  k = %" GSYM "\n", udata->k);
  printf("  initial N = %li\n", (long int)udata->N);

  /* Initialize data structures */
  y = N_VNew_Serial(N, ctx); /* Create initial serial vector for solution */
  if (check_flag((void*)y, "N_VNew_Serial", 0)) { return 1; }
  N_VConst(ZERO, y); /* Set initial conditions */

  /* output mesh to disk */
  XFID = fopen("heat_mesh.txt", "w");

  /* output initial mesh to disk */
  for (i = 0; i < udata->N; i++) { fprintf(XFID, " %.16" ESYM, udata->x[i]); }
  fprintf(XFID, "\n");

  /* Open output stream for results, access data array */
  UFID = fopen("heat1D.txt", "w");

  /* output initial condition to disk */
  data = N_VGetArrayPointer(y);
  for (i = 0; i < udata->N; i++) { fprintf(UFID, " %.16" ESYM, data[i]); }
  fprintf(UFID, "\n");

  /* Initialize the ARK timestepper */
  arkode_mem = ARKStepCreate(NULL, f, T0, y, ctx);
  if (check_flag((void*)arkode_mem, "ARKStepCreate", 0)) { return 1; }

  /* Set routines */
  flag = ARKodeSetUserData(arkode_mem,
                           (void*)udata); /* Pass udata to user functions */
  if (check_flag(&flag, "ARKodeSetUserData", 1)) { return 1; }
  flag = ARKodeSetMaxNumSteps(arkode_mem, 10000); /* Increase max num steps  */
  if (check_flag(&flag, "ARKodeSetMaxNumSteps", 1)) { return 1; }
  flag = ARKodeSStolerances(arkode_mem, rtol, atol); /* Specify tolerances */
  if (check_flag(&flag, "ARKodeSStolerances", 1)) { return 1; }
  flag = ARKStepSetAdaptivityMethod(arkode_mem, 2, 1, 0,
                                    NULL); /* Set adaptivity method */
  if (check_flag(&flag, "ARKodeSetAdaptivityMethod", 1)) { return 1; }
  flag = ARKodeSetPredictorMethod(arkode_mem, 0); /* Set predictor method */
  if (check_flag(&flag, "ARKodeSetPredictorMethod", 1)) { return 1; }

  /* Specify linearly implicit RHS, with time-dependent Jacobian */
  flag = ARKodeSetLinear(arkode_mem, 1);
  if (check_flag(&flag, "ARKodeSetLinear", 1)) { return 1; }

  /* Initialize PCG solver -- no preconditioning, with up to N iterations  */
  LS = SUNLinSol_PCG(y, 0, (int)N, ctx);
  if (check_flag((void*)LS, "SUNLinSol_PCG", 0)) { return 1; }

  /* Linear solver interface -- set user-supplied J*v routine (no 'jtsetup' required) */
  flag = ARKodeSetLinearSolver(arkode_mem, LS,
                               NULL); /* Attach linear solver to ARKODE */
  if (check_flag(&flag, "ARKodeSetLinearSolver", 1)) { return 1; }
  flag = ARKodeSetJacTimes(arkode_mem, NULL, Jac); /* Set the Jacobian routine */
  if (check_flag(&flag, "ARKodeSetJacTimes", 1)) { return 1; }

  /* Main time-stepping loop: calls ARKodeEvolve to perform the integration, then
     prints results.  Stops when the final time has been reached */
  t     = T0;
  olddt = ZERO;
  newdt = ZERO;
  printf("  iout          dt_old                 dt_new               "
         "||u||_rms       N   NNI  NLI\n");
  printf(" --------------------------------------------------------------------"
         "--------------------\n");
  printf(" %4i  %19.15" ESYM "  %19.15" ESYM "  %19.15e  %li   %2i  %3i\n",
         iout, olddt, newdt, sqrt(N_VDotProd(y, y) / udata->N),
         (long int)udata->N, 0, 0);
  while (t < Tf)
  {
    /* "set" routines */
    flag = ARKodeSetStopTime(arkode_mem, Tf);
    if (check_flag(&flag, "ARKodeSetStopTime", 1)) { return 1; }

    /* call integrator */
    flag = ARKodeEvolve(arkode_mem, Tf, y, &t, ARK_ONE_STEP);
    if (check_flag(&flag, "ARKodeEvolve", 1)) { return 1; }

    /* "get" routines */
    flag = ARKodeGetLastStep(arkode_mem, &olddt);
    if (check_flag(&flag, "ARKodeGetLastStep", 1)) { return 1; }
    flag = ARKodeGetCurrentStep(arkode_mem, &newdt);
    if (check_flag(&flag, "ARKodeGetCurrentStep", 1)) { return 1; }
    flag = ARKodeGetNumNonlinSolvIters(arkode_mem, &nni);
    if (check_flag(&flag, "ARKodeGetNumNonlinSolvIters", 1)) { return 1; }
    flag = ARKodeGetNumLinIters(arkode_mem, &nli);
    if (check_flag(&flag, "ARKodeGetNumLinIters", 1)) { return 1; }

    /* print current solution stats */
    iout++;
    printf(" %4i  %19.15" ESYM "  %19.15" ESYM "  %19.15e  %li   %2li  %3li\n",
           iout, olddt, newdt, sqrt(N_VDotProd(y, y) / udata->N),
           (long int)udata->N, nni, nli);
    nni_tot += nni;
    nli_tot += nli;

    /* output results and current mesh to disk */
    data = N_VGetArrayPointer(y);
    for (i = 0; i < udata->N; i++) { fprintf(UFID, " %.16" ESYM, data[i]); }
    fprintf(UFID, "\n");
    for (i = 0; i < udata->N; i++) { fprintf(XFID, " %.16" ESYM, udata->x[i]); }
    fprintf(XFID, "\n");

    /* adapt the spatial mesh */
    xnew = adapt_mesh(y, &Nnew, udata);
    if (check_flag(xnew, "ark_adapt", 0)) { return 1; }

    /* create N_Vector of new length */
    y2 = N_VNew_Serial(Nnew, ctx);
    if (check_flag((void*)y2, "N_VNew_Serial", 0)) { return 1; }

    /* project solution onto new mesh */
    flag = project(udata->N, udata->x, y, Nnew, xnew, y2);
    if (check_flag(&flag, "project", 1)) { return 1; }

    /* delete old vector, old mesh */
    N_VDestroy(y);
    free(udata->x);

    /* swap x and xnew so that new mesh is stored in udata structure */
    udata->x = xnew;
    xnew     = NULL;
    udata->N = Nnew; /* store size of new mesh */

    /* swap y and y2 so that y holds new solution */
    yt = y;
    y  = y2;
    y2 = yt;

    /* call ARKodeResize to notify integrator of change in mesh */
    flag = ARKodeResize(arkode_mem, y, hscale, t, NULL, NULL);
    if (check_flag(&flag, "ARKodeResize", 1)) { return 1; }

    /* destroy and re-allocate linear solver memory; reattach to ARKODE interface */
    SUNLinSolFree(LS);
    LS = SUNLinSol_PCG(y, 0, (int)N, ctx);
    if (check_flag((void*)LS, "SUNLinSol_PCG", 0)) { return 1; }
    flag = ARKodeSetLinearSolver(arkode_mem, LS, NULL);
    if (check_flag(&flag, "ARKodeSetLinearSolver", 1)) { return 1; }
    flag = ARKodeSetJacTimes(arkode_mem, NULL, Jac);
    if (check_flag(&flag, "ARKodeSetJacTimes", 1)) { return 1; }
  }
  printf(" --------------------------------------------------------------------"
         "--------------------\n");

  /* print some final statistics */
  printf(" Final solver statistics:\n");
  printf("   Total number of time steps = %i\n", iout);
  printf("   Total nonlinear iterations = %li\n", nni_tot);
  printf("   Total linear iterations    = %li\n\n", nli_tot);

  /* Clean up and return with successful completion */
  fclose(UFID);
  fclose(XFID);
  N_VDestroy(y);  /* Free vectors */
  free(udata->x); /* Free user data */
  free(udata);
  ARKodeFree(&arkode_mem); /* Free integrator memory */
  SUNLinSolFree(LS);       /* Free linear solver */
  SUNContext_Free(&ctx);   /* Free context */

  return 0;
}